

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeGraph.cpp
# Opt level: O3

void __thiscall Assimp::OptimizeGraphProcess::Execute(OptimizeGraphProcess *this,aiScene *pScene)

{
  LockedSetType *this_00;
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  aiNodeAnim *paVar3;
  aiBone *paVar4;
  aiCamera *paVar5;
  aiLight *paVar6;
  aiNode *paVar7;
  pointer puVar8;
  _List_node_base *p_Var9;
  uint uVar10;
  bool bVar11;
  Logger *pLVar12;
  size_t sVar13;
  aiAnimation **ppaVar14;
  aiMesh **ppaVar15;
  aiNode *this_01;
  aiNode **ppaVar16;
  runtime_error *this_02;
  uint uVar17;
  aiAnimation *paVar18;
  aiMesh *paVar19;
  ulong uVar20;
  _List_node_base *p_Var21;
  ulong uVar22;
  list<aiNode_*,_std::allocator<aiNode_*>_> nodes;
  _List_node_base local_5e8;
  long local_5d8;
  char *local_5d0;
  char local_5c0 [16];
  undefined1 local_5b0 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_438 [32];
  
  pLVar12 = DefaultLogger::get();
  Logger::debug(pLVar12,"OptimizeGraphProcess begin");
  this->count_merged = 0;
  this->nodes_in = 0;
  this->nodes_out = 0;
  this->mScene = pScene;
  local_438[0]._M_dataplus._M_p = (pointer)((ulong)local_438[0]._M_dataplus._M_p._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (&this->meshes,(ulong)pScene->mNumMeshes,(value_type_conflict4 *)local_438);
  FindInstancedMeshes(this,pScene->mRootNode);
  this_00 = &this->locked;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->_M_t);
  for (p_Var21 = (this->locked_nodes).
                 super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var21 != (_List_node_base *)&this->locked_nodes; p_Var21 = p_Var21->_M_next) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)this_00,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var21 + 1));
  }
  uVar17 = pScene->mNumAnimations;
  if (uVar17 != 0) {
    ppaVar14 = pScene->mAnimations;
    uVar22 = 0;
    do {
      paVar18 = ppaVar14[uVar22];
      if (paVar18->mNumChannels != 0) {
        uVar20 = 0;
        do {
          paVar3 = paVar18->mChannels[uVar20];
          pcVar1 = (paVar3->mNodeName).data;
          local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
          sVar13 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,pcVar1,(paVar3->mNodeName).data + sVar13);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
            operator_delete(local_438[0]._M_dataplus._M_p);
          }
          uVar20 = uVar20 + 1;
          ppaVar14 = pScene->mAnimations;
          paVar18 = ppaVar14[uVar22];
        } while (uVar20 < paVar18->mNumChannels);
        uVar17 = pScene->mNumAnimations;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar17);
  }
  uVar17 = pScene->mNumMeshes;
  if (uVar17 != 0) {
    ppaVar15 = pScene->mMeshes;
    uVar22 = 0;
    do {
      paVar19 = ppaVar15[uVar22];
      if (paVar19->mNumBones != 0) {
        uVar20 = 0;
        do {
          paVar4 = paVar19->mBones[uVar20];
          pcVar1 = (paVar4->mName).data;
          local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
          sVar13 = strlen(pcVar1);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_438,pcVar1,(paVar4->mName).data + sVar13);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)this_00,local_438);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
            operator_delete(local_438[0]._M_dataplus._M_p);
          }
          puVar8 = (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar22;
          *puVar8 = *puVar8 + 2;
          uVar20 = uVar20 + 1;
          ppaVar15 = pScene->mMeshes;
          paVar19 = ppaVar15[uVar22];
        } while (uVar20 < paVar19->mNumBones);
        uVar17 = pScene->mNumMeshes;
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < uVar17);
  }
  if (pScene->mNumCameras != 0) {
    uVar22 = 0;
    do {
      paVar5 = pScene->mCameras[uVar22];
      pcVar1 = (paVar5->mName).data;
      local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
      sVar13 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,pcVar1,(paVar5->mName).data + sVar13);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
        operator_delete(local_438[0]._M_dataplus._M_p);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < pScene->mNumCameras);
  }
  if (pScene->mNumLights != 0) {
    uVar22 = 0;
    do {
      paVar6 = pScene->mLights[uVar22];
      pcVar1 = (paVar6->mName).data;
      local_438[0]._M_dataplus._M_p = (pointer)&local_438[0].field_2;
      sVar13 = strlen(pcVar1);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,pcVar1,(paVar6->mName).data + sVar13);
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,local_438);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438[0]._M_dataplus._M_p != &local_438[0].field_2) {
        operator_delete(local_438[0]._M_dataplus._M_p);
      }
      uVar22 = uVar22 + 1;
    } while (uVar22 < pScene->mNumLights);
  }
  this_01 = (aiNode *)operator_new(0x478);
  paVar2 = &local_438[0].field_2;
  local_438[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"$Reserved_And_Evil","");
  aiNode::aiNode(this_01,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_438[0]._M_dataplus._M_p);
  }
  pcVar1 = (this_01->mName).data;
  local_438[0]._M_dataplus._M_p = (pointer)paVar2;
  sVar13 = strlen(pcVar1);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_438,pcVar1,(this_01->mName).data + sVar13);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)this_00,local_438);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_438[0]._M_dataplus._M_p);
  }
  paVar7 = pScene->mRootNode;
  uVar17 = (paVar7->mName).length;
  uVar10 = 0x3ff;
  if (uVar17 < 0x3ff) {
    uVar10 = uVar17;
  }
  uVar22 = (ulong)uVar10;
  memcpy((void *)((long)&local_438[0]._M_dataplus._M_p + 4),(paVar7->mName).data,uVar22);
  *(undefined1 *)((long)&local_438[0]._M_dataplus._M_p + uVar22 + 4) = 0;
  paVar7->mParent = this_01;
  this_01->mNumChildren = 1;
  ppaVar16 = (aiNode **)operator_new__(8);
  this_01->mChildren = ppaVar16;
  *ppaVar16 = pScene->mRootNode;
  local_5d8 = 0;
  local_5e8._M_next = &local_5e8;
  local_5e8._M_prev = &local_5e8;
  CollectNewChildren(this,this_01,(list<aiNode_*,_std::allocator<aiNode_*>_> *)&local_5e8);
  if (local_5d8 != 1) {
    __assert_fail("nodes.size() == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/OptimizeGraph.cpp"
                  ,0x131,"virtual void Assimp::OptimizeGraphProcess::Execute(aiScene *)");
  }
  if (this_01->mNumChildren == 1) {
    ppaVar16 = this_01->mChildren;
    pScene->mRootNode = *ppaVar16;
    *ppaVar16 = (aiNode *)0x0;
    aiNode::~aiNode(this_01);
    operator_delete(this_01);
    this_01 = pScene->mRootNode;
  }
  else {
    if (this_01->mNumChildren == 0) {
      pScene->mRootNode = (aiNode *)0x0;
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_5b0._0_8_ = local_5b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_5b0,"After optimizing the scene graph, no data remains","");
      std::runtime_error::runtime_error(this_02,(string *)local_5b0);
      *(undefined ***)this_02 = &PTR__runtime_error_008dc448;
      __cxa_throw(this_02,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    pScene->mRootNode = this_01;
    (this_01->mName).length = uVar10;
    memcpy(pcVar1,(void *)((long)&local_438[0]._M_dataplus._M_p + 4),uVar22);
    (this_01->mName).data[uVar22] = '\0';
  }
  this_01->mParent = (aiNode *)0x0;
  bVar11 = DefaultLogger::isNullLogger();
  if (!bVar11) {
    if (this->nodes_in == this->nodes_out) {
      pLVar12 = DefaultLogger::get();
      Logger::debug(pLVar12,"OptimizeGraphProcess finished");
    }
    else {
      pLVar12 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[45]>
                ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5b0,
                 (char (*) [45])"OptimizeGraphProcess finished; Input nodes: ");
      std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_5b0,", Output nodes: ",0x10);
      std::ostream::_M_insert<unsigned_long>((ulong)local_5b0);
      std::__cxx11::stringbuf::str();
      Logger::info(pLVar12,local_5d0);
      if (local_5d0 != local_5c0) {
        operator_delete(local_5d0);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
      std::ios_base::~ios_base((ios_base *)(local_5b0 + 0x70));
    }
  }
  puVar8 = (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar8) {
    (this->meshes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar8;
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(&this_00->_M_t);
  p_Var21 = local_5e8._M_next;
  while (p_Var21 != &local_5e8) {
    p_Var9 = (((_List_base<aiNode_*,_std::allocator<aiNode_*>_> *)&p_Var21->_M_next)->_M_impl).
             _M_node.super__List_node_base._M_next;
    operator_delete(p_Var21);
    p_Var21 = p_Var9;
  }
  return;
}

Assistant:

void OptimizeGraphProcess::Execute( aiScene* pScene) {
    ASSIMP_LOG_DEBUG("OptimizeGraphProcess begin");
    nodes_in = nodes_out = count_merged = 0;
    mScene = pScene;

    meshes.resize(pScene->mNumMeshes,0);
    FindInstancedMeshes(pScene->mRootNode);

    // build a blacklist of identifiers. If the name of a node matches one of these, we won't touch it
    locked.clear();
    for (std::list<std::string>::const_iterator it = locked_nodes.begin(); it != locked_nodes.end(); ++it) {
#ifdef AI_OG_USE_HASHING
        locked.insert(SuperFastHash((*it).c_str()));
#else
        locked.insert(*it);
#endif
    }

    for (unsigned int i = 0; i < pScene->mNumAnimations; ++i) {
        for (unsigned int a = 0; a < pScene->mAnimations[i]->mNumChannels; ++a) {
            aiNodeAnim* anim = pScene->mAnimations[i]->mChannels[a];
            locked.insert(AI_OG_GETKEY(anim->mNodeName));
        }
    }

    for (unsigned int i = 0; i < pScene->mNumMeshes; ++i) {
        for (unsigned int a = 0; a < pScene->mMeshes[i]->mNumBones; ++a) {

            aiBone* bone = pScene->mMeshes[i]->mBones[a];
            locked.insert(AI_OG_GETKEY(bone->mName));

            // HACK: Meshes referencing bones may not be transformed; we need to look them.
            // The easiest way to do this is to increase their reference counters ...
            meshes[i] += 2;
        }
    }

    for (unsigned int i = 0; i < pScene->mNumCameras; ++i) {
        aiCamera* cam = pScene->mCameras[i];
        locked.insert(AI_OG_GETKEY(cam->mName));
    }

    for (unsigned int i = 0; i < pScene->mNumLights; ++i) {
        aiLight* lgh = pScene->mLights[i];
        locked.insert(AI_OG_GETKEY(lgh->mName));
    }

    // Insert a dummy master node and make it read-only
    aiNode* dummy_root = new aiNode(AI_RESERVED_NODE_NAME);
    locked.insert(AI_OG_GETKEY(dummy_root->mName));

    const aiString prev = pScene->mRootNode->mName;
    pScene->mRootNode->mParent = dummy_root;

    dummy_root->mChildren = new aiNode*[dummy_root->mNumChildren = 1];
    dummy_root->mChildren[0] = pScene->mRootNode;

    // Do our recursive processing of scenegraph nodes. For each node collect
    // a fully new list of children and allow their children to place themselves
    // on the same hierarchy layer as their parents.
    std::list<aiNode*> nodes;
    CollectNewChildren (dummy_root,nodes);

    ai_assert(nodes.size() == 1);

    if (dummy_root->mNumChildren == 0) {
        pScene->mRootNode = NULL;
        throw DeadlyImportError("After optimizing the scene graph, no data remains");
    }

    if (dummy_root->mNumChildren > 1) {
        pScene->mRootNode = dummy_root;

        // Keep the dummy node but assign the name of the old root node to it
        pScene->mRootNode->mName = prev;
    }
    else {

        // Remove the dummy root node again.
        pScene->mRootNode = dummy_root->mChildren[0];

        dummy_root->mChildren[0] = NULL;
        delete dummy_root;
    }

    pScene->mRootNode->mParent = NULL;
    if (!DefaultLogger::isNullLogger()) {
        if ( nodes_in != nodes_out) {
            ASSIMP_LOG_INFO_F("OptimizeGraphProcess finished; Input nodes: ", nodes_in, ", Output nodes: ", nodes_out);
        } else {
            ASSIMP_LOG_DEBUG("OptimizeGraphProcess finished");
        }
    }
    meshes.clear();
    locked.clear();
}